

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gs.c
# Opt level: O2

int32 gs_mgau_shortlist(gs_t *gs,int m,int n,float32 *feat,int bst_codeid)

{
  uint uVar1;
  int32 *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = (*gs->codemap[m])[bst_codeid];
  uVar5 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = n;
  }
  uVar4 = 0;
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    if ((uVar1 >> (uVar5 & 0x1f) & 1) != 0) {
      gs->mgau_sl[(int)uVar4] = uVar5;
      uVar4 = uVar4 + 1;
    }
  }
  piVar2 = gs->mgau_sl;
  piVar2[(int)uVar4] = -1;
  if (uVar4 == 0) {
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      piVar2[uVar6] = (int32)uVar6;
    }
    piVar2[uVar3] = -1;
    uVar4 = uVar3;
    if (n < 1) {
      uVar4 = 0;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
              ,0x127,"No active gaussian found in senone %d, with num. component = %d\n",m);
    }
  }
  return uVar4;
}

Assistant:

int32
gs_mgau_shortlist(gs_t * gs, int m, int n, float32 * feat, int bst_codeid)
{
    uint32 map;
    int32 bit_id;
    int32 nc;
    nc = 0;

    map = 0;
    map = gs->codemap[m][0][bst_codeid];

#if 0
    E_INFO("The map is %u, the length of gaussian %d\n", map, n);
#endif

    for (bit_id = 0; bit_id < n; bit_id++) {
        if (map & (1 << bit_id))
            gs->mgau_sl[nc++] = bit_id;
    }
    gs->mgau_sl[nc] = -1;

    if (nc == 0) {
        /* 20040222 ARCHAN : added to safe guard Gaussian Selection anomality */
        /* Special case when the number of components is smaller than the max. */
        /* This happens when zero vectors were removed from the codebook. */

        for (bit_id = 0; bit_id < n; bit_id++) {
            gs->mgau_sl[nc++] = bit_id;
        }
        gs->mgau_sl[nc] = -1;
    }

    if (nc == 0) {
        E_INFO
            ("No active gaussian found in senone %d, with num. component = %d\n",
             m, n);
    }
    return nc;

}